

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O1

CoverCrossSymbol *
slang::ast::CoverCrossSymbol::fromSyntax
          (Scope *scope,CoverCrossSyntax *syntax,
          SmallVectorBase<const_slang::ast::Symbol_*> *implicitMembers)

{
  IdentifierNameSyntax *syntax_00;
  Compilation *args;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  int iVar1;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar2;
  CoverpointSymbol *pCVar3;
  undefined4 extraout_var;
  CoverCrossSymbol *this;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  Token *this_00;
  ulong uVar4;
  long lVar5;
  string_view name;
  SmallVector<const_slang::ast::CoverpointSymbol_*,_5UL> targets;
  SourceLocation local_a0;
  span<const_slang::ast::CoverpointSymbol_*,_18446744073709551615UL> local_98;
  string_view local_88;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_78;
  SmallVectorBase<const_slang::ast::CoverpointSymbol_*> local_70 [2];
  
  local_88 = (string_view)ZEXT816(0);
  local_a0 = (SourceLocation)0x0;
  local_78 = implicitMembers;
  if (syntax->label == (NamedLabelSyntax *)0x0) {
    this_00 = &syntax->cross;
  }
  else {
    local_88 = parsing::Token::valueText(&syntax->label->name);
    this_00 = &syntax->label->name;
  }
  local_a0 = parsing::Token::location(this_00);
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_70[0].cap = 5;
  uVar4 = (syntax->items).elements._M_extent._M_extent_value + 1;
  src = extraout_RDX;
  if (1 < uVar4) {
    uVar4 = uVar4 >> 1;
    lVar5 = 0;
    do {
      ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((syntax->items).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar5));
      syntax_00 = (IdentifierNameSyntax *)*ppSVar2;
      name = parsing::Token::valueText(&syntax_00->identifier);
      pCVar3 = (CoverpointSymbol *)Scope::find(scope,name);
      if ((pCVar3 == (CoverpointSymbol *)0x0) || ((pCVar3->super_Symbol).kind != Coverpoint)) {
        pCVar3 = CoverpointSymbol::fromImplicit(scope,syntax_00);
        local_98._M_ptr = (pointer)pCVar3;
        SmallVectorBase<slang::ast::CoverpointSymbol_const*>::
        emplace_back<slang::ast::CoverpointSymbol_const*>
                  ((SmallVectorBase<slang::ast::CoverpointSymbol_const*> *)local_70,
                   (CoverpointSymbol **)&local_98);
        local_98._M_ptr = (pointer)pCVar3;
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)local_78,(Symbol **)&local_98);
        src = extraout_RDX_01;
      }
      else {
        local_98._M_ptr = (pointer)pCVar3;
        SmallVectorBase<slang::ast::CoverpointSymbol_const*>::
        emplace_back<slang::ast::CoverpointSymbol_const*>
                  ((SmallVectorBase<slang::ast::CoverpointSymbol_const*> *)local_70,
                   (CoverpointSymbol **)&local_98);
        src = extraout_RDX_00;
      }
      lVar5 = lVar5 + 0x30;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  args = scope->compilation;
  iVar1 = SmallVectorBase<const_slang::ast::CoverpointSymbol_*>::copy
                    (local_70,(EVP_PKEY_CTX *)args,src);
  local_98._M_ptr = (pointer)CONCAT44(extraout_var,iVar1);
  this = BumpAllocator::
         emplace<slang::ast::CoverCrossSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,std::span<slang::ast::CoverpointSymbol_const*,18446744073709551615ul>>
                   (&args->super_BumpAllocator,args,&local_88,&local_a0,&local_98);
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_01._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_01._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&this->super_Symbol,scope,syntax_01);
  if (local_70[0].data_ != (pointer)local_70[0].firstElement) {
    operator_delete(local_70[0].data_);
  }
  return this;
}

Assistant:

CoverCrossSymbol& CoverCrossSymbol::fromSyntax(const Scope& scope, const CoverCrossSyntax& syntax,
                                               SmallVectorBase<const Symbol*>& implicitMembers) {
    std::string_view name;
    SourceLocation loc;
    if (syntax.label) {
        name = syntax.label->name.valueText();
        loc = syntax.label->name.location();
    }
    else {
        loc = syntax.cross.location();
    }

    SmallVector<const CoverpointSymbol*> targets;
    for (auto item : syntax.items) {
        auto symbol = scope.find(item->identifier.valueText());
        if (symbol && symbol->kind == SymbolKind::Coverpoint) {
            targets.push_back(&symbol->as<CoverpointSymbol>());
        }
        else {
            // If we didn't find a coverpoint, create one implicitly
            // that will be initialized with this expression.
            auto& newPoint = CoverpointSymbol::fromImplicit(scope, *item);
            targets.push_back(&newPoint);
            implicitMembers.push_back(&newPoint);
        }
    }

    auto& comp = scope.getCompilation();
    auto result = comp.emplace<CoverCrossSymbol>(comp, name, loc, targets.copy(comp));
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);
    return *result;
}